

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

int Aig_ManPartitionedSat
              (Aig_Man_t *p,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  byte *pbVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Man_t *pAVar9;
  int *__s;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  sat_solver *s;
  void **ppvVar16;
  long lVar17;
  ulong uVar18;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vPio2Id;
  timespec local_a8;
  Vec_Ptr_t *local_98;
  uint local_8c;
  uint local_88;
  int local_84;
  sat_solver *local_80;
  Vec_Int_t *local_78;
  int local_6c;
  int *local_68;
  ulong local_60;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  local_8c = nConfTotal;
  local_84 = fAlignPol;
  iVar5 = clock_gettime(3,&local_a8);
  if (iVar5 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  switch(nAlgo) {
  case 0:
    pVVar7 = Aig_ManPartitionMonolithic(p);
    break;
  case 1:
    pVVar7 = Aig_ManPartitionLevelized(p,nPartSize);
    break;
  case 2:
    iVar5 = 0;
    goto LAB_0069cae1;
  case 3:
    iVar5 = 1;
LAB_0069cae1:
    pVVar7 = Aig_ManPartitionDfs(p,nPartSize,iVar5);
    break;
  default:
    puts("Unknown partitioning algorithm.");
    return -1;
  }
  if (fVerbose != 0) {
    uVar14 = pVVar7->nSize;
    if ((ulong)uVar14 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *pVVar7->pArray;
      if (1 < (int)uVar14) {
        uVar11 = 1;
        do {
          iVar15 = pVVar7->pArray[uVar11];
          if (iVar5 <= iVar15) {
            iVar5 = iVar15;
          }
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
    }
    iVar15 = 0x9eff65;
    printf("Partitioning derived %d partitions. ",(ulong)(iVar5 + 1));
    Abc_Print(iVar15,"%s =","Time");
    iVar15 = 3;
    iVar5 = clock_gettime(3,&local_a8);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar12 - lVar17) / 1000000.0);
  }
  pVVar8 = Aig_ManPartSplit(p,pVVar7,&local_48,&local_50);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (fVerbose != 0) {
    iVar5 = 0x9eff8a;
    printf("Partions were transformed into AIGs. ");
    Abc_Print(iVar5,"%s =","Time");
    iVar15 = 3;
    iVar5 = clock_gettime(3,&local_a8);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar12 - lVar17) / 1000000.0);
  }
  local_98 = pVVar8;
  if ((fSynthesize != 0) && (iVar5 = pVVar8->nSize, 0 < (long)iVar5)) {
    ppvVar16 = pVVar8->pArray;
    lVar17 = 0;
    do {
      pAVar2 = (Aig_Man_t *)ppvVar16[lVar17];
      pAVar9 = Dar_ManRwsat(pAVar2,0,0);
      ppvVar16[lVar17] = pAVar9;
      Aig_ManStop(pAVar2);
      lVar17 = lVar17 + 1;
    } while (iVar5 != lVar17);
  }
  local_80 = sat_solver_new();
  iVar5 = p->vObjs->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar15 = iVar5;
  }
  pVVar7->nCap = iVar15;
  if (iVar15 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar5;
    __s = (int *)0x0;
    pVVar8 = local_98;
  }
  else {
    __s = (int *)malloc((long)iVar15 << 2);
    pVVar8 = local_98;
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar5;
    if (__s == (int *)0x0) {
      __s = (int *)0x0;
    }
    else {
      memset(__s,0,(long)iVar5 << 2);
    }
  }
  local_60 = (ulong)pVVar8->nSize;
  local_78 = pVVar7;
  if ((long)local_60 < 1) {
    sat_solver_delete(local_80);
    iVar5 = -1;
LAB_0069d062:
    ppvVar16 = pVVar8->pArray;
    if (ppvVar16 == (void **)0x0) goto LAB_0069d074;
  }
  else {
    local_38 = pVVar8->pArray;
    uVar11 = 0;
    local_88 = 0;
    local_40 = local_50;
    local_58 = local_48;
    uVar14 = local_8c;
    local_68 = __s;
    do {
      pVVar8 = local_40;
      pVVar7 = local_78;
      pAVar2 = (Aig_Man_t *)local_38[uVar11];
      iVar5 = clock_gettime(3,&local_a8);
      if (iVar5 < 0) {
        lVar17 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      if (local_84 == 0) {
        pVVar10 = pAVar2->vObjs;
        if (0 < pVVar10->nSize) {
          lVar12 = 0;
          do {
            if (pVVar10->pArray[lVar12] != (void *)0x0) {
              pbVar1 = (byte *)((long)pVVar10->pArray[lVar12] + 0x18);
              *pbVar1 = *pbVar1 & 0xf7;
              pVVar10 = pAVar2->vObjs;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar10->nSize);
        }
      }
      else {
        if ((long)local_58->nSize <= (long)uVar11) goto LAB_0069d157;
        Aig_ManPartSetNodePolarity(p,pAVar2,(Vec_Int_t *)local_58->pArray[uVar11]);
      }
      s = local_80;
      if ((long)local_58->nSize <= (long)uVar11) {
LAB_0069d157:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      if ((long)pVVar8->nSize <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      Aig_ManAddNewCnfToSolver
                (local_80,pAVar2,pVVar7,(Vec_Int_t *)local_58->pArray[uVar11],
                 (Vec_Ptr_t *)pVVar8->pArray[uVar11],local_84);
      iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)(int)uVar14,0,0,0);
      if (fVerbose != 0) {
        uVar13 = local_88 + pAVar2->nObjs[5] + pAVar2->nObjs[6];
        local_6c = iVar5;
        uVar6 = sat_solver_nvars(s);
        iVar5 = 0x9effb0;
        local_88 = uVar13;
        printf("%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",uVar11 & 0xffffffff,
               (ulong)uVar13,(ulong)uVar6,(ulong)(s->stats).clauses,(ulong)(s->stats).learnts);
        Abc_Print(iVar5,"%s =","Time");
        iVar15 = 3;
        iVar5 = clock_gettime(3,&local_a8);
        if (iVar5 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar12 + lVar17) / 1000000.0);
        iVar5 = local_6c;
      }
      bVar4 = true;
      if (iVar5 != 1) {
        if (iVar5 == -1) {
          iVar5 = 1;
          goto LAB_0069d027;
        }
        bVar4 = false;
      }
      uVar14 = uVar14 - (int)(s->stats).conflicts;
      if ((int)uVar14 < 1) {
        printf("Exceeded the limit on the total number of conflicts (%d).\n",(ulong)local_8c);
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_60);
    s = local_80;
    iVar5 = -1;
    if (bVar4) {
      Aig_ManDeriveCounterExample(p,local_78,local_80);
      iVar5 = 0;
    }
LAB_0069d027:
    sat_solver_delete(s);
    uVar11 = local_60;
    __s = local_68;
    pVVar8 = local_98;
    if ((int)local_60 < 1) goto LAB_0069d062;
    ppvVar16 = local_98->pArray;
    uVar18 = 0;
    do {
      Aig_ManStop((Aig_Man_t *)ppvVar16[uVar18]);
      uVar18 = uVar18 + 1;
    } while (uVar11 != uVar18);
  }
  free(ppvVar16);
LAB_0069d074:
  free(pVVar8);
  iVar15 = local_48->nSize;
  if (0 < iVar15) {
    lVar17 = 0;
    do {
      pvVar3 = local_48->pArray[lVar17];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar15 = local_48->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar15);
  }
  if (local_48->pArray != (void **)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  iVar15 = local_50->nSize;
  if (0 < iVar15) {
    lVar17 = 0;
    do {
      pvVar3 = local_50->pArray[lVar17];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar15 = local_50->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar15);
  }
  if (local_50->pArray != (void **)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(local_78);
  return iVar5;
}

Assistant:

int Aig_ManPartitionedSat( Aig_Man_t * p, int nAlgo, int nPartSize, 
    int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    sat_solver * pSat;
    Vec_Ptr_t * vAigs;
    Vec_Vec_t * vPio2Id, * vPart2Pos;
    Aig_Man_t * pAig, * pTemp;
    Vec_Int_t * vNode2Part, * vNode2Var;
    int nConfRemaining = nConfTotal, nNodes = 0;
    int i, status, RetValue = -1;
    abctime clk;

    // perform partitioning according to the selected algorithm
    clk = Abc_Clock();
    switch ( nAlgo )
    {
    case 0: 
        vNode2Part = Aig_ManPartitionMonolithic( p );
        break;
    case 1: 
        vNode2Part = Aig_ManPartitionLevelized( p, nPartSize );
        break;
    case 2: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 0 );
        break;
    case 3: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 1 );
        break;
    default:
        printf( "Unknown partitioning algorithm.\n" );
        return -1;
    }

    if ( fVerbose )
    {
    printf( "Partitioning derived %d partitions. ", Vec_IntFindMax(vNode2Part) + 1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // split the original AIG into partition AIGs (vAigs)
    // also, derives mapping of PIs/POs of partition AIGs into original nodes
    // also, derives mapping of POs of the original AIG into partitions
    vAigs = Aig_ManPartSplit( p, vNode2Part, (Vec_Ptr_t **)&vPio2Id, (Vec_Ptr_t **)&vPart2Pos );
    Vec_IntFree( vNode2Part );

    if ( fVerbose )
    {
    printf( "Partions were transformed into AIGs. " );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // synthesize partitions
    if ( fSynthesize )
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
        pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 );
        Vec_PtrWriteEntry( vAigs, i, pAig );
        Aig_ManStop( pTemp );
    }

    // start the SAT solver
    pSat = sat_solver_new();
//    pSat->verbosity = fVerbose;
    // start mapping of the original AIG IDs into their SAT variable numbers
    vNode2Var = Vec_IntStart( Aig_ManObjNumMax(p) );

    // add partitions, one at a time, and run the SAT solver 
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
clk = Abc_Clock();
        // transform polarity of the AIG
        if ( fAlignPol )
            Aig_ManPartSetNodePolarity( p, pAig, Vec_VecEntryInt(vPio2Id,i) );
        else
            Aig_ManPartResetNodePolarity( pAig );
        // add CNF of this partition to the SAT solver
        if ( Aig_ManAddNewCnfToSolver( pSat, pAig, vNode2Var, 
            Vec_VecEntryInt(vPio2Id,i), Vec_VecEntry(vPart2Pos,i), fAlignPol ) )
        {
            RetValue = 1;
            break;
        }
        // call the SAT solver
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfRemaining, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",
                i, nNodes += Aig_ManNodeNum(pAig), sat_solver_nvars(pSat), 
                (int)pSat->stats.clauses, (int)pSat->stats.learnts );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
        // analize the result
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        else if ( status == l_True )
            RetValue = 0;
        else
            RetValue = -1;
        nConfRemaining -= pSat->stats.conflicts;
        if ( nConfRemaining <= 0 )
        {
            printf( "Exceeded the limit on the total number of conflicts (%d).\n", nConfTotal );
            break;
        }
    }
    if ( RetValue == 0 )
        Aig_ManDeriveCounterExample( p, vNode2Var, pSat );
    // cleanup
    sat_solver_delete( pSat );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
    Vec_VecFree( vPio2Id );
    Vec_VecFree( vPart2Pos );
    Vec_IntFree( vNode2Var );
    return RetValue;
}